

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zt-walk.c
# Opt level: O0

ztresult_t
zt_walk(ztstruct_t *metastruct,void *structure,ztregion_t *regions,int nregions,
       ztwalkhandlers_t *walkhandlers,void *opaque)

{
  ulong uVar1;
  ulong uVar2;
  ztresult_t zVar3;
  int iVar4;
  ulong *puVar5;
  ulong *puVar6;
  int in_ECX;
  void *in_RDX;
  ztstruct_t *in_RSI;
  int *in_RDI;
  undefined8 *in_R8;
  ztwalkhandlers_t *in_R9;
  void *pvalue_7;
  ztversion_t *pvalue_6;
  unsigned_long index_1;
  char *ptr_1;
  uchar **pp_1;
  char *end_1;
  char *base_1;
  ztarray_t *array_1;
  int r;
  unsigned_long index;
  char *ptr;
  char *pp;
  char *end;
  char *base;
  ztarray_t *array;
  int j;
  uchar **ppstruct;
  int i;
  void *pstruct;
  ztuint_t *pvalue_5;
  ztuint_t **ppdata_2;
  ztuint_t *pvalue_4;
  ztushort_t *pvalue_3;
  ztushort_t **ppdata_1;
  ztushort_t *pvalue_2;
  ztuchar_t *pvalue_1;
  ztuchar_t **ppdata;
  ztuchar_t *pvalue;
  int stride;
  void *rawvalue;
  ztfield_t *f;
  int rc;
  int local_13c;
  ulong local_128;
  int local_f4;
  ulong local_f0;
  int local_bc;
  int local_ac;
  undefined4 *local_48;
  uint in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffd8;
  
  local_48 = *(undefined4 **)(in_RDI + 2);
  do {
    if ((undefined4 *)(*(long *)(in_RDI + 2) + (long)*in_RDI * 0x48) <= local_48) {
      return 0;
    }
    puVar5 = (ulong *)((long)&in_RSI->nfields + *(long *)(local_48 + 4));
    if (local_48[10] == 0) {
      local_13c = local_48[8];
    }
    else {
      local_13c = local_48[10];
    }
    switch(*local_48) {
    case 0:
      iVar4 = (*(code *)*in_R8)(*(undefined8 *)(local_48 + 2),puVar5,(long)(int)local_48[8],
                                (long)local_13c,in_R9);
      goto joined_r0x001043f1;
    case 1:
      iVar4 = (*(code *)*in_R8)(*(undefined8 *)(local_48 + 2),*puVar5,(long)(int)local_48[8],
                                (long)local_13c,in_R9);
joined_r0x001043f1:
      if (iVar4 != 0) {
        return iVar4;
      }
      goto LAB_00104f50;
    case 2:
      iVar4 = (*(code *)in_R8[1])(*(undefined8 *)(local_48 + 2),puVar5,(long)(int)local_48[8],
                                  (long)local_13c,in_R9);
      break;
    case 3:
      iVar4 = (*(code *)in_R8[1])(*(undefined8 *)(local_48 + 2),*puVar5,(long)(int)local_48[8],
                                  (long)local_13c,in_R9);
      break;
    case 4:
      iVar4 = (*(code *)in_R8[2])(*(undefined8 *)(local_48 + 2),puVar5,(long)(int)local_48[8],
                                  (long)local_13c,in_R9);
      break;
    case 5:
      iVar4 = (*(code *)in_R8[2])(*(undefined8 *)(local_48 + 2),*puVar5,(long)(int)local_48[8],
                                  (long)local_13c,in_R9);
      break;
    case 6:
      if (local_48[8] == 1) {
        iVar4 = (*(code *)in_R8[5])(*(undefined8 *)(local_48 + 2),in_R9);
        if (iVar4 != 0) {
          return iVar4;
        }
        zVar3 = zt_walk(in_RSI,in_RDX,(ztregion_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                        (int)((ulong)in_R8 >> 0x20),in_R9,(void *)(ulong)in_stack_ffffffffffffffc0);
        if (zVar3 != 0) {
          return zVar3;
        }
        iVar4 = (*(code *)in_R8[6])(in_R9);
      }
      else {
        iVar4 = (*(code *)in_R8[7])(*(undefined8 *)(local_48 + 2),local_48[8],in_R9);
        if (iVar4 != 0) {
          return iVar4;
        }
        for (local_ac = 0; local_ac < (int)local_48[8]; local_ac = local_ac + 1) {
          iVar4 = (*(code *)in_R8[5])(0,in_R9);
          if (iVar4 != 0) {
            return iVar4;
          }
          zVar3 = zt_walk(in_RSI,in_RDX,(ztregion_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                          (int)((ulong)in_R8 >> 0x20),in_R9,(void *)(ulong)in_stack_ffffffffffffffc0
                         );
          if (zVar3 != 0) {
            return zVar3;
          }
          iVar4 = (*(code *)in_R8[6])(in_R9);
          if (iVar4 != 0) {
            return iVar4;
          }
        }
        iVar4 = (*(code *)in_R8[8])(in_R9);
      }
      break;
    case 7:
      if (local_48[8] == 1) {
        iVar4 = (*(code *)in_R8[5])(*(undefined8 *)(local_48 + 2),in_R9);
        if (iVar4 != 0) {
          return iVar4;
        }
        zVar3 = zt_walk(in_RSI,in_RDX,(ztregion_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                        (int)((ulong)in_R8 >> 0x20),in_R9,(void *)(ulong)in_stack_ffffffffffffffc0);
        if (zVar3 != 0) {
          return zVar3;
        }
        iVar4 = (*(code *)in_R8[6])(in_R9);
      }
      else {
        iVar4 = (*(code *)in_R8[7])(*(undefined8 *)(local_48 + 2),local_48[8],in_R9);
        if (iVar4 != 0) {
          return iVar4;
        }
        for (local_bc = 0; local_bc < (int)local_48[8]; local_bc = local_bc + 1) {
          iVar4 = (*(code *)in_R8[5])(0,in_R9);
          if (iVar4 != 0) {
            return iVar4;
          }
          zVar3 = zt_walk(in_RSI,in_RDX,(ztregion_t *)CONCAT44(in_ECX,in_stack_ffffffffffffffd8),
                          (int)((ulong)in_R8 >> 0x20),in_R9,(void *)(ulong)in_stack_ffffffffffffffc0
                         );
          if (zVar3 != 0) {
            return zVar3;
          }
          iVar4 = (*(code *)in_R8[6])(in_R9);
          if (iVar4 != 0) {
            return iVar4;
          }
        }
        iVar4 = (*(code *)in_R8[8])(in_R9);
      }
      break;
    case 8:
      if (local_48[8] != 1) {
        return 0x90;
      }
      puVar5 = *(ulong **)(local_48 + 0xe);
      uVar1 = *(ulong *)((long)&in_RSI->nfields + *(long *)(local_48 + 4));
      if (uVar1 == 0) {
        local_f0 = 0xffffffffffffffff;
      }
      else {
        if ((uVar1 < *puVar5) || (*puVar5 + puVar5[1] <= uVar1)) {
          return 0x80;
        }
        local_f0 = (uVar1 - *puVar5) / (puVar5[1] / (ulong)(long)(int)puVar5[2]);
      }
      iVar4 = (*(code *)in_R8[3])(*(undefined8 *)(local_48 + 2),local_f0,in_R9);
      break;
    case 9:
      if (local_48[8] != 1) {
        return 0x90;
      }
      local_f4 = 0;
      while ((local_f4 < in_ECX &&
             (*(long *)((long)in_RDX + (long)local_f4 * 0x20) != *(long *)(local_48 + 0x10)))) {
        local_f4 = local_f4 + 1;
      }
      if (local_f4 == in_ECX) {
        return 0x20;
      }
      puVar6 = (ulong *)((long)in_RDX + (long)local_f4 * 0x20 + 8);
      uVar1 = *puVar6;
      uVar2 = *puVar5;
      if (uVar2 == 0) {
        local_128 = 0xffffffffffffffff;
      }
      else {
        if ((uVar2 < uVar1) ||
           (*puVar6 + *(long *)((long)in_RDX + (long)local_f4 * 0x20 + 0x10) <= uVar2)) {
          return 0x80;
        }
        local_128 = (uVar2 - uVar1) /
                    (*(ulong *)((long)in_RDX + (long)local_f4 * 0x20 + 0x10) /
                    (ulong)(long)*(int *)((long)in_RDX + (long)local_f4 * 0x20 + 0x18));
      }
      iVar4 = (*(code *)in_R8[3])(*(undefined8 *)(local_48 + 2),local_128,in_R9);
      break;
    case 10:
      iVar4 = (*(code *)in_R8[4])(*(undefined8 *)(local_48 + 2),(int)*puVar5,in_R9);
      break;
    case 0xb:
      iVar4 = (*(code *)in_R8[9])(*(undefined8 *)(local_48 + 2),local_48[9],puVar5,in_R9);
      break;
    default:
      return 0x60;
    }
    if (iVar4 != 0) {
      return iVar4;
    }
LAB_00104f50:
    local_48 = local_48 + 0x12;
  } while( true );
}

Assistant:

ztresult_t zt_walk(const ztstruct_t       *metastruct,
                   const void             *structure,
                   const ztregion_t       *regions,
                   int                     nregions,
                   const ztwalkhandlers_t *walkhandlers,
                   void                   *opaque)
{
  int              rc;
  const ztfield_t *f;

  for (f = &metastruct->fields[0]; f < &metastruct->fields[metastruct->nfields]; f++)
  {
    const void *rawvalue = (const char *) structure + f->offset;
    int         stride   = (f->stride == ZT_NO_STRIDE) ? f->nelems : f->stride;

    switch (f->type)
    {
    case zttype_uchar:
      {
        const ztuchar_t *pvalue = rawvalue;
        rc = walkhandlers->uchar(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_ucharptr:
      {
        const ztuchar_t **ppdata = (const ztuchar_t **) rawvalue;
        const ztuchar_t  *pvalue = *ppdata;
        rc = walkhandlers->uchar(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_ushort:
      {
        const ztushort_t *pvalue = rawvalue;
        rc = walkhandlers->ushort(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_ushortptr:
      {
        const ztushort_t **ppdata = (const ztushort_t **) rawvalue;
        const ztushort_t  *pvalue = *ppdata;
        rc = walkhandlers->ushort(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_uint:
      {
        const ztuint_t *pvalue = rawvalue;
        rc = walkhandlers->uint(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_uintptr:
      {
        const ztuint_t **ppdata = (const ztuint_t **) rawvalue;
        const ztuint_t  *pvalue = *ppdata;
        rc = walkhandlers->uint(f->name, pvalue, f->nelems, stride, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_struct:
      {
        const void *pstruct = rawvalue;

        if (f->nelems == 1)
        {
          rc = walkhandlers->startstruct(f->name, opaque);
          if (rc)
            return rc;

          rc = zt_walk(f->metadata,
                       pstruct,
                       regions,
                       nregions,
                       walkhandlers,
                       opaque);
          if (rc)
            return rc;

          rc = walkhandlers->endstruct(opaque);
          if (rc)
            return rc;
        }
        else
        {
          int i;

          rc = walkhandlers->startarray(f->name, f->nelems, opaque);
          if (rc)
            return rc;

          for (i = 0; i < f->nelems; i++)
          {
            rc = walkhandlers->startstruct(NULL /* name */, opaque);
            if (rc)
              return rc;

            rc = zt_walk(f->metadata,
                         (char *) pstruct + i * f->size,
                         regions,
                         nregions,
                         walkhandlers,
                         opaque);
            if (rc)
              return rc;

            rc = walkhandlers->endstruct(opaque);
            if (rc)
              return rc;
          }

          rc = walkhandlers->endarray(opaque);
          if (rc)
            return rc;
        }
        break;
      }

    case zttype_structptr:
      {
        const unsigned char **ppstruct = (const unsigned char **) rawvalue;

        if (f->nelems == 1)
        {
          rc = walkhandlers->startstruct(f->name, opaque);
          if (rc)
            return rc;

          rc = zt_walk(f->metadata,
                       *ppstruct,
                       regions,
                       nregions,
                       walkhandlers,
                       opaque);
          if (rc)
            return rc;

          rc = walkhandlers->endstruct(opaque);
          if (rc)
            return rc;
        }
        else
        {
          int j;

          rc = walkhandlers->startarray(f->name, f->nelems, opaque);
          if (rc)
            return rc;

          for (j = 0; j < f->nelems; j++)
          {
            rc = walkhandlers->startstruct(NULL, opaque);
            if (rc)
              return rc;

            rc = zt_walk(f->metadata,
                         *ppstruct++,
                         regions,
                         nregions,
                         walkhandlers,
                         opaque);
            if (rc)
              return rc;

            rc = walkhandlers->endstruct(opaque);
            if (rc)
              return rc;
          }

          rc = walkhandlers->endarray(opaque);
          if (rc)
            return rc;
        }
        break;
      }

    case zttype_staticarrayidx:
      {
        const ztarray_t *array;
        const char      *base;
        const char      *end;
        const char      *pp;
        const char      *ptr;
        unsigned long    index;

        if (f->nelems != 1)
          return ztresult_BAD_FIELD;

        array = f->array;
        base  = array->base;
        end   = (const char *) array->base + array->length;
        pp    = (const char *) structure + f->offset;
        ptr   = *((const char **) pp);

        if (ptr == NULL)
        {
          index = ULONG_MAX;
        }
        else
        {
          if (ptr < base || ptr >= end)
            return ztresult_BAD_POINTER;

          index = (ptr - base) / (array->length / array->nelems);
        }
        rc = walkhandlers->index(f->name, index, opaque);
        if (rc)
          return rc;

        break;
      }

    case zttype_arrayidx:
      {
        int                   r;
        const ztarray_t      *array;
        const char           *base;
        const char           *end;
        const unsigned char **pp;
        const char           *ptr;
        unsigned long         index;

        if (f->nelems != 1)
          return ztresult_BAD_FIELD;

        /* find f->regionid in regions[] */
        for (r = 0; r < nregions; r++)
          if (regions[r].id == f->regionid)
            break;

        if (r == nregions)
          return ztresult_UNKNOWN_REGION;

        /* use the array spec to turn it into an index */
        array = &regions[r].spec;
        base  = array->base;
        end   = (const char *) array->base + array->length;
        pp    = (const unsigned char **) rawvalue;
        ptr   = *((const char **) pp);

        if (ptr == NULL)
        {
          index = ULONG_MAX;
        }
        else
        {
          if (ptr < base || ptr >= end)
            return ztresult_BAD_POINTER;

          index = (ptr - base) / (array->length / array->nelems);
        }
        rc = walkhandlers->index(f->name, index, opaque);
        if (rc)
          return rc;

        break;
      }

    case zttype_version:
      {
        const ztversion_t *pvalue = rawvalue;
        rc = walkhandlers->version(f->name, *pvalue, opaque);
        if (rc)
          return rc;
        break;
      }

    case zttype_custom:
      {
        const void *pvalue = rawvalue;
        rc = walkhandlers->custom(f->name, f->typeidx, pvalue, opaque);
        if (rc)
          return rc;
        break;
      }

    default:
      return ztresult_UNKNOWN_TYPE;
    }
  }

  return ztresult_OK;
}